

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-x86_64.h
# Opt level: O2

int target_fixed_hard_reg_p(MIR_reg_t hard_reg)

{
  uint uVar1;
  
  if (hard_reg < 0x22) {
    uVar1 = hard_reg & 0x3e;
    return (int)((uVar1 == 0x20 || uVar1 == 0x18) || (uVar1 == 10 || uVar1 == 4));
  }
  __assert_fail("hard_reg <= MAX_HARD_REG",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-x86_64.h"
                ,0x31,"int target_fixed_hard_reg_p(MIR_reg_t)");
}

Assistant:

static inline int target_fixed_hard_reg_p (MIR_reg_t hard_reg) {
  assert (hard_reg <= MAX_HARD_REG);
  return (hard_reg == BP_HARD_REG || hard_reg == SP_HARD_REG || hard_reg == TEMP_INT_HARD_REG1
          || hard_reg == TEMP_INT_HARD_REG2 || hard_reg == TEMP_FLOAT_HARD_REG1
          || hard_reg == TEMP_FLOAT_HARD_REG2 || hard_reg == TEMP_DOUBLE_HARD_REG1
          || hard_reg == TEMP_DOUBLE_HARD_REG2 || hard_reg == ST0_HARD_REG
          || hard_reg == ST1_HARD_REG);
}